

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

void __thiscall
LEARNER::learner<char,_example>::multipredict
          (learner<char,_example> *this,example *ec,size_t lo,size_t count,polyprediction *pred,
          bool finalize_predictions)

{
  undefined8 *puVar1;
  ulong in_RCX;
  size_t in_RDX;
  example *in_RSI;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  size_t c;
  ulong local_38;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    increment_offset(in_RSI,*(size_t *)(in_RDI + 0xe0),in_RDX);
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      (**(code **)(in_RDI + 0x30))
                (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20),in_RSI);
      if ((in_R9B & 1) == 0) {
        *(float *)(in_R8 + local_38 * 0x20) = in_RSI->partial_prediction;
      }
      else {
        puVar1 = (undefined8 *)(in_R8 + local_38 * 0x20);
        *puVar1 = (in_RSI->pred).scalars._begin;
        puVar1[1] = (in_RSI->pred).scalars._end;
        puVar1[2] = (in_RSI->pred).scalars.end_array;
        puVar1[3] = (in_RSI->pred).scalars.erase_count;
      }
      increment_offset(in_RSI,*(size_t *)(in_RDI + 0xe0),1);
    }
    decrement_offset(in_RSI,*(size_t *)(in_RDI + 0xe0),in_RDX + in_RCX);
  }
  else {
    increment_offset(in_RSI,*(size_t *)(in_RDI + 0xe0),in_RDX);
    (**(code **)(in_RDI + 0x40))
              (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20),in_RSI,in_RCX,
               *(undefined8 *)(in_RDI + 0xe0),in_R8,in_R9B & 1);
    decrement_offset(in_RSI,*(size_t *)(in_RDI + 0xe0),in_RDX);
  }
  return;
}

Assistant:

inline void multipredict(E& ec, size_t lo, size_t count, polyprediction* pred, bool finalize_predictions)
  {
    assert((is_multiline && std::is_same<multi_ex, E>::value) ||
        (!is_multiline && std::is_same<example, E>::value));  // sanity check under debug compile
    if (learn_fd.multipredict_f == NULL)
    {
      increment_offset(ec, increment, lo);
      for (size_t c = 0; c < count; c++)
      {
        learn_fd.predict_f(learn_fd.data, *learn_fd.base, (void*)&ec);
        if (finalize_predictions)
          pred[c] = ec.pred;  // TODO: this breaks for complex labels because = doesn't do deep copy!
        else
          pred[c].scalar = ec.partial_prediction;
        // pred[c].scalar = finalize_prediction ec.partial_prediction; // TODO: this breaks for complex labels because =
        // doesn't do deep copy! // note works if ec.partial_prediction, but only if finalize_prediction is run????
        increment_offset(ec, increment, 1);
      }
      decrement_offset(ec, increment, lo + count);
    }
    else
    {
      increment_offset(ec, increment, lo);
      learn_fd.multipredict_f(learn_fd.data, *learn_fd.base, (void*)&ec, count, increment, pred, finalize_predictions);
      decrement_offset(ec, increment, lo);
    }
  }